

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::XMLURL::setURL(XMLURL *this,XMLCh *baseURL,XMLCh *relativeURL,XMLURL *xmlURL)

{
  bool bVar1;
  undefined1 local_88 [8];
  XMLURL basePart;
  XMLURL *xmlURL_local;
  XMLCh *relativeURL_local;
  XMLCh *baseURL_local;
  XMLURL *this_local;
  
  basePart._80_8_ = xmlURL;
  cleanUp(this);
  bVar1 = parse(relativeURL,(XMLURL *)basePart._80_8_);
  if (bVar1) {
    bVar1 = isRelative(this);
    if (((!bVar1) || (baseURL == (XMLCh *)0x0)) || (*baseURL == L'\0')) {
      this_local._7_1_ = 1;
      goto LAB_002d3530;
    }
    XMLURL((XMLURL *)local_88,this->fMemoryManager);
    bVar1 = parse(baseURL,(XMLURL *)local_88);
    if ((bVar1) && (bVar1 = conglomerateWithBase(this,(XMLURL *)local_88,false), bVar1)) {
      this_local._7_1_ = 1;
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    ~XMLURL((XMLURL *)local_88);
    if (bVar1) goto LAB_002d3530;
  }
  this_local._7_1_ = 0;
LAB_002d3530:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool XMLURL::setURL(const XMLCh* const    baseURL
                  , const XMLCh* const    relativeURL
                  , XMLURL& xmlURL)
{
    cleanUp();

    // Parse our URL string
    if (parse(relativeURL, xmlURL))
    {
	    //  If its relative and the base is non-null and non-empty, then
	    //  parse the base URL string and conglomerate them.
	    //
	    if (isRelative() && baseURL && *baseURL)
	    {
	        XMLURL basePart(fMemoryManager);
            if (parse(baseURL, basePart)  && conglomerateWithBase(basePart, false))
            {
		        return true;
		    }
	    }
        else
            return true;
    }
    return false;
}